

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O1

bool __thiscall
covenant::Solver<covenant::Sym>::refine
          (Solver<covenant::Sym> *this,witness_t *witness,GeneralizationMethod gen,
          bool REFINE_ONLY_FIRST)

{
  size_type *psVar1;
  pointer this_00;
  pointer pCVar2;
  pointer pDVar3;
  char cVar4;
  const_iterator cVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined8 extraout_RAX;
  ulong uVar9;
  string *psVar10;
  undefined7 in_register_00000009;
  TermFactory *tfac;
  type __n;
  void *__buf;
  ulong uVar11;
  pointer pCVar12;
  char *pcVar13;
  int iVar14;
  bool bVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  witness_t tmp;
  dfa_t gen_lang;
  dfa_t Cex;
  undefined1 *local_460;
  char *local_458;
  undefined1 local_450;
  undefined7 uStack_44f;
  undefined8 local_440;
  long *local_438;
  witness_impl *local_430;
  int local_424;
  char **local_420;
  long local_418;
  char *local_410 [2];
  string local_400;
  TermFactory local_3e0;
  ostream *local_3d0;
  TermFactory local_3c8;
  undefined1 local_3b8 [32];
  int local_398 [4];
  key_type local_388;
  key_type local_368;
  key_type local_348;
  undefined1 local_328 [8];
  undefined1 local_320 [48];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2f0;
  vector<bool,_std::allocator<bool>_> local_2d8;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> local_2b0;
  DFA<covenant::Sym> local_298;
  undefined1 *local_228;
  long local_220;
  undefined1 local_218 [16];
  string local_208;
  key_type local_1e8;
  DFA<covenant::Sym> local_1c8;
  CondEpsGen<covenant::Sym> local_158;
  
  cVar4 = avy::AvyLogFlag;
  tfac = (TermFactory *)CONCAT71(in_register_00000009,REFINE_ONLY_FIRST);
  local_430 = (witness_impl *)witness;
  if (avy::AvyLogFlag == '\x01') {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"solver","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,&local_1e8);
    bVar15 = cVar5._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
  }
  else {
    bVar15 = false;
  }
  if ((cVar4 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2)) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if (bVar15) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Solution found: ",0x10);
    local_3b8._0_8_ = (this->tfac).px;
    local_3b8._8_8_ = (this->tfac).pn.pi_;
    if ((sp_counted_base *)local_3b8._8_8_ != (sp_counted_base *)0x0) {
      LOCK();
      ((sp_counted_base *)local_3b8._8_8_)->use_count_ =
           ((sp_counted_base *)local_3b8._8_8_)->use_count_ + 1;
      UNLOCK();
    }
    witness_impl::to_string_abi_cxx11_((string *)&local_158,local_430,(witness_t *)local_3b8,tfac);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_158.digest,
                        (long)local_158.word.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if (local_158.digest !=
        (cfg_digest_t *)((long)&local_158.word.super__Vector_base<int,_std::allocator<int>_> + 8U))
    {
      operator_delete(local_158.digest);
    }
    boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 8));
  }
  if ((this->opts).is_dot_enabled == true) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_328,
               (vector<int,_std::allocator<int>_> *)local_430);
    local_3c8.px = (this->tfac).px;
    local_3c8.pn.pi_ = (this->tfac).pn.pi_;
    if (local_3c8.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_3c8.pn.pi_)->use_count_ = (local_3c8.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    witness_impl::to_automata<covenant::Sym>
              ((DFA<covenant::Sym> *)&local_158,(witness_t *)local_328,&local_3c8);
    boost::detail::shared_count::~shared_count(&local_3c8.pn);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Cex ","");
    DFA<covenant::Sym>::print_dot
              ((DFA<covenant::Sym> *)&local_158,(ostream *)&this->refine_log,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if (local_158.produce_rev.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(local_158.produce_rev.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      local_158.produce_rev.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.produce_rev.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_158.produced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_158.produced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_offset = 0;
      local_158.produced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)((long)&local_158.produce_fwd.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 + 8));
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               *)((long)&local_158.word.super__Vector_base<int,_std::allocator<int>_> + 0x10));
    boost::detail::shared_count::~shared_count((shared_count *)&local_158.word);
    if ((void *)CONCAT71(local_328._1_7_,local_328[0]) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_328._1_7_,local_328[0]));
    }
  }
  if (gen == MAX_GEN) {
    local_438 = (long *)operator_new(0x10);
    *local_438 = (long)&PTR__EpsRefine_001aaff8;
    local_438[1] = *(long *)&this->alphstart;
  }
  else {
    local_438 = (long *)operator_new(8);
    *local_438 = (long)&PTR__EpsRefine_001ab048;
  }
  pCVar12 = (this->digests).
            super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->digests).
      super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pCVar12) {
    local_440 = 0;
  }
  else {
    local_3d0 = (ostream *)&this->refine_log;
    local_424 = (uint)REFINE_ONLY_FIRST << 2;
    uVar11 = 0;
    local_440 = 0;
    do {
      cVar4 = avy::AvyLogFlag;
      if (((this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
        local_3e0.px = (this->tfac).px;
        local_3e0.pn.pi_ = (this->tfac).pn.pi_;
        if (local_3e0.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_3e0.pn.pi_)->use_count_ = (local_3e0.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        CondEpsGen<covenant::Sym>::CondEpsGen
                  (&local_158,pCVar12 + uVar11,(vector<int,_std::allocator<int>_> *)local_430,
                   &local_3e0);
        boost::detail::shared_count::~shared_count(&local_3e0.pn);
        cVar4 = avy::AvyLogFlag;
        uVar7 = (ulong)((local_158.digest)->startSym * local_158.nstates * local_158.nstates +
                        local_158.nstates + -1);
        uVar9 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar9 = uVar7;
        }
        if ((local_158.produced.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)uVar9 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)]
             >> (uVar7 & 0x3f) & 1) == 0) {
          (**(code **)(*local_438 + 0x10))(&local_1c8,local_438,&local_158);
          DFA<covenant::Sym>::eps_elim(&local_1c8);
          pcVar13 = local_320 + 0xe;
          if ((this->opts).is_dot_enabled == true) {
            local_420 = local_410;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_420,"Generalized cex wrt CFG ","");
            local_460 = &local_450;
            local_458 = (char *)0x0;
            local_450 = 0;
            local_320._16_8_ = local_328 + 2;
            local_2b0.m_czero = '0';
            local_2b0.m_zero = 0x30;
            local_320._24_8_ = pcVar13;
            local_2b0.m_value = (type_conflict)uVar11;
            local_2b0.m_finish = pcVar13;
            local_320._16_8_ =
                 boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::
                 convert(&local_2b0);
            local_320._24_8_ = pcVar13;
            std::__cxx11::string::replace((ulong)&local_460,0,local_458,local_320._16_8_);
            pcVar13 = (char *)0xf;
            if (local_420 != local_410) {
              pcVar13 = local_410[0];
            }
            if (pcVar13 < local_458 + local_418) {
              pcVar13 = (char *)0xf;
              if (local_460 != &local_450) {
                pcVar13 = (char *)CONCAT71(uStack_44f,local_450);
              }
              if (pcVar13 < local_458 + local_418) goto LAB_0014bbf8;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_460,0,(char *)0x0,(ulong)local_420);
            }
            else {
LAB_0014bbf8:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_460);
            }
            psVar1 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_400.field_2._M_allocated_capacity = *psVar1;
              local_400.field_2._8_8_ = puVar8[3];
              local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
            }
            else {
              local_400.field_2._M_allocated_capacity = *psVar1;
              local_400._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_400._M_string_length = puVar8[1];
            *puVar8 = psVar1;
            puVar8[1] = 0;
            *(undefined1 *)psVar1 = 0;
            DFA<covenant::Sym>::print_dot(&local_1c8,local_3d0,&local_400);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p);
            }
            if (local_460 != &local_450) {
              operator_delete(local_460);
            }
            if (local_420 != local_410) {
              operator_delete(local_420);
            }
          }
          pCVar2 = (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          DFA<covenant::Sym>::difference
                    ((optional<covenant::DFA<covenant::Sym>_> *)local_328,
                     (this->reg_langs).
                     super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar11,&local_1c8,
                     pCVar2[uVar11].alphstart,pCVar2[uVar11].alphsz);
          if (local_328[0] == false) {
            psVar10 = (string *)__cxa_allocate_exception(0x20);
            local_228 = local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,"refinement did not make any progress","");
            *(string **)psVar10 = psVar10 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar10,local_228,local_228 + local_220);
            __cxa_throw(psVar10,&error::typeinfo,error::~error);
          }
          pDVar3 = (this->reg_langs).
                   super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          this_00 = pDVar3 + uVar11;
          boost::shared_ptr<covenant::TerminalFactory>::operator=
                    (&this_00->_tfac,(shared_ptr<covenant::TerminalFactory> *)local_320);
          pDVar3[uVar11].start = local_320._16_4_;
          std::
          vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
          ::operator=(&pDVar3[uVar11].trans,
                      (vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                       *)(local_320 + 0x18));
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator=(&this_00->eps,&local_2f0);
          std::vector<bool,_std::allocator<bool>_>::operator=(&this_00->accepts,&local_2d8);
          cVar4 = avy::AvyLogFlag;
          if (avy::AvyLogFlag == '\x01') {
            local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"solver","");
            cVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)avy::AvyLog_abi_cxx11_,&local_388);
            bVar15 = cVar5._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
          }
          else {
            bVar15 = false;
          }
          if ((cVar4 != '\0') &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2)) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          if (bVar15) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"New refined regular approximation:\n",0x23);
            if (local_328[0] == false) {
              __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",
                            0x4bc,
                            "reference_type boost::optional<covenant::DFA<covenant::Sym>>::get() [T = covenant::DFA<covenant::Sym>]"
                           );
            }
            local_298._tfac.px = (element_type *)local_320._0_8_;
            local_298._tfac.pn.pi_ = (sp_counted_base *)local_320._8_8_;
            if ((pointer)local_320._8_8_ != (pointer)0x0) {
              LOCK();
              *(int *)(local_320._8_8_ + 8) = *(int *)(local_320._8_8_ + 8) + 1;
              UNLOCK();
            }
            local_298.start = local_320._16_4_;
            __n = (type)local_320._0_8_;
            std::
            vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
            ::vector(&local_298.trans,
                     (vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                      *)(local_320 + 0x18));
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::vector(&local_298.eps,&local_2f0);
            std::vector<bool,_std::allocator<bool>_>::vector(&local_298.accepts,&local_2d8);
            poVar6 = (ostream *)DFA<covenant::Sym>::write(&local_298,0x1ad2b8,__buf,(size_t)__n);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if (local_298.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_298.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              local_298.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_298.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              local_298.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_298.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              local_298.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector(&local_298.eps);
            std::
            vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
            ::~vector(&local_298.trans);
            boost::detail::shared_count::~shared_count(&local_298._tfac.pn);
          }
          cVar4 = avy::AvyLogFlag;
          if (avy::AvyLogFlag == '\x01') {
            local_3b8._16_8_ = local_398;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_3b8 + 0x10),"verbose","");
            cVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)avy::AvyLog_abi_cxx11_,(key_type *)(local_3b8 + 0x10));
            bVar15 = cVar5._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
          }
          else {
            bVar15 = false;
          }
          if ((cVar4 != '\0') && ((int *)local_3b8._16_8_ != local_398)) {
            operator_delete((void *)local_3b8._16_8_);
          }
          if (bVar15) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Automata ",9);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," refined.\n",10);
          }
          boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                    ((optional_base<covenant::DFA<covenant::Sym>_> *)local_328);
          if (local_1c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_1c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_1c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_1c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_1c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_1c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_1c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_1c8.eps);
          std::
          vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
          ::~vector(&local_1c8.trans);
          boost::detail::shared_count::~shared_count(&local_1c8._tfac.pn);
          local_440 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          iVar14 = local_424;
        }
        else {
          if (avy::AvyLogFlag == '\x01') {
            local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"verbose","");
            cVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)avy::AvyLog_abi_cxx11_,&local_368);
            bVar15 = cVar5._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
          }
          else {
            bVar15 = false;
          }
          if ((cVar4 != '\0') &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2)) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          iVar14 = 6;
          if (bVar15) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Cex is accepted by CFG ",0x17);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          }
        }
        CondEpsGen<covenant::Sym>::~CondEpsGen(&local_158);
        if ((iVar14 != 6) && (iVar14 != 0)) break;
      }
      else {
        if (avy::AvyLogFlag == '\x01') {
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"verbose","");
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)avy::AvyLog_abi_cxx11_,&local_348);
          bVar15 = cVar5._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
        }
        else {
          bVar15 = false;
        }
        if ((cVar4 != '\0') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2)) {
          operator_delete(local_348._M_dataplus._M_p);
        }
        if (bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Automata ",9);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," is exact\n",10);
        }
      }
      uVar11 = (ulong)((type_conflict)uVar11 + 1);
      pCVar12 = (this->digests).
                super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->digests).
                     super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12 >> 3) *
              -0x79435e50d79435e5;
    } while (uVar11 <= uVar9 && uVar9 - uVar11 != 0);
  }
  (**(code **)(*local_438 + 8))();
  cVar4 = avy::AvyLogFlag;
  if (avy::AvyLogFlag == '\x01') {
    local_158.digest =
         (cfg_digest_t *)((long)&local_158.word.super__Vector_base<int,_std::allocator<int>_> + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"solver","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,(key_type *)&local_158);
    bVar15 = cVar5._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
  }
  else {
    bVar15 = false;
  }
  if ((cVar4 != '\0') &&
     (local_158.digest !=
      (cfg_digest_t *)((long)&local_158.word.super__Vector_base<int,_std::allocator<int>_> + 8U))) {
    operator_delete(local_158.digest);
  }
  if (bVar15) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Refinement done.\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"===================================================\n",0x34);
  }
  return (bool)((byte)local_440 & 1);
}

Assistant:

bool refine(witness_t& witness, 
              GeneralizationMethod gen, 
              bool REFINE_ONLY_FIRST) 
  {


    LOG("solver", 
        cout << "Solution found: ";
        cout << witness_impl::to_string(witness, tfac) << "\n");
    
    if (opts.is_dot_enabled)
    {
      witness_t tmp(witness);
      dfa_t Cex = witness_impl::to_automata<EdgeSym> (tmp, tfac);
                                                      
      Cex.print_dot(refine_log, "Cex ");
    }

   
    // Choose here the generalization method.
    eps_refine_t* r = NULL;
    if(gen == MAX_GEN)
      r = new max_eps_refine_t(alphstart, alphsz);
    else 
      r = new greedy_eps_refine_t();
    
    bool refined = false;
    for(unsigned int li = 0; li < digests.size(); li++)
    {
      // L_i is regular, so w \in L_i
      if(exact[li]) 
      {
        LOG("verbose" , cout << "Automata " << li << " is exact\n");
        continue;
      }
      
      // First, we check if the witness is in the language.
      cond_eps_gen_t gen(digests[li], witness, tfac);
      if(!gen.is_empty())
      {
        LOG("verbose", cout << "Cex is accepted by CFG " << li << "\n");
        continue;
      }
      
      // Otherwise, we refine it.
      dfa_t gen_lang(r->refine(gen));
      
// #ifndef REFINE_DIFF
//       // Haven't currently extended solvers to handle complemented
//       // languages.
//       gen_lang.eps_elim();
//       dfa_t ref_complement(complement(makeDFA(gen_lang, 
//                                                       cfgs[li].alphstart, 
//                                                       cfgs[li].alphsz)));
      
//       // We can either just add ref_complement to the set of regular
//       // languages, or intersect it with an approximation.
//       reg_langs.push_back(ref_complement);
// #else
      gen_lang.eps_elim();

      if (opts.is_dot_enabled)
      {
        gen_lang.print_dot(refine_log, 
                           string("Generalized cex wrt CFG ") + 
                           boost::lexical_cast<string> (li)) ;
      }

      boost::optional<dfa_t> refined_fa = dfa_t::difference (reg_langs[li], 
                                                             gen_lang, 
                                                             cfgs[li].alphstart, 
                                                             cfgs[li].alphsz);
      
      if (!refined_fa)
      {
        throw error ("refinement did not make any progress");
      }
      
      reg_langs[li] = *refined_fa;
 
      LOG("solver", 
            cout << "New refined regular approximation:\n" << *refined_fa << "\n");
           

//#endif
      refined = true;
      LOG("verbose", cout << "Automata " << li << " refined.\n");
      if(REFINE_ONLY_FIRST)
        break;
    }
    
    delete r;
    
    LOG("solver", 
         cout << "Refinement done.\n";
         cout << "===================================================\n");
    
    return refined;
  }